

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

mbedtls_cipher_info_t *
mbedtls_cipher_info_from_psa
          (psa_algorithm_t alg,psa_key_type_t key_type,size_t key_bits,
          mbedtls_cipher_id_t *cipher_id)

{
  mbedtls_cipher_info_t *pmVar1;
  mbedtls_cipher_id_t local_30;
  mbedtls_cipher_mode_t local_2c;
  mbedtls_cipher_id_t cipher_id_tmp;
  mbedtls_cipher_mode_t mode;
  mbedtls_cipher_id_t *cipher_id_local;
  size_t key_bits_local;
  psa_key_type_t key_type_local;
  psa_algorithm_t alg_local;
  
  key_bits_local._4_4_ = alg;
  if ((alg & 0x7f000000) == 0x6000000) {
    key_bits_local._4_4_ = alg & 0xffffc0ff;
  }
  if (((key_bits_local._4_4_ & 0x7f000000) == 0x4000000) ||
     ((key_bits_local._4_4_ & 0x7f000000) == 0x6000000)) {
    if (key_bits_local._4_4_ == 0x4600100) {
      local_2c = MBEDTLS_MODE_CBC;
    }
    else if (key_bits_local._4_4_ == 0x4600101) {
      local_2c = MBEDTLS_MODE_CBC;
    }
    else if ((key_bits_local._4_4_ == 0x4800001) || (key_bits_local._4_4_ == 0x4800005)) {
      local_2c = MBEDTLS_MODE_STREAM;
    }
    else if (key_bits_local._4_4_ == 0x4c00001) {
      local_2c = MBEDTLS_MODE_CTR;
    }
    else if (key_bits_local._4_4_ == 0x4c00002) {
      local_2c = MBEDTLS_MODE_CFB;
    }
    else if (key_bits_local._4_4_ == 0x4c00003) {
      local_2c = MBEDTLS_MODE_OFB;
    }
    else if (key_bits_local._4_4_ == 0x6000005) {
      local_2c = MBEDTLS_MODE_CHACHAPOLY;
    }
    else if (key_bits_local._4_4_ == 0x6400001) {
      local_2c = MBEDTLS_MODE_CCM;
    }
    else {
      if (key_bits_local._4_4_ != 0x6400002) {
        return (mbedtls_cipher_info_t *)0x0;
      }
      local_2c = MBEDTLS_MODE_GCM;
    }
  }
  else {
    if (key_bits_local._4_4_ != 0x2c00002) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    local_2c = MBEDTLS_MODE_ECB;
  }
  cipher_id_local = (mbedtls_cipher_id_t *)key_bits;
  if (key_type == 0x2002) {
    local_30 = MBEDTLS_CIPHER_ID_ARC4;
  }
  else if (key_type == 0x2004) {
    local_30 = MBEDTLS_CIPHER_ID_CHACHA20;
  }
  else if (key_type == 0x2301) {
    if (key_bits == 0x40) {
      local_30 = MBEDTLS_CIPHER_ID_DES;
    }
    else {
      local_30 = MBEDTLS_CIPHER_ID_3DES;
    }
    if (key_bits == 0x80) {
      cipher_id_local = (mbedtls_cipher_id_t *)0xc0;
    }
  }
  else if (key_type == 0x2400) {
    local_30 = MBEDTLS_CIPHER_ID_AES;
  }
  else {
    if (key_type != 0x2403) {
      return (mbedtls_cipher_info_t *)0x0;
    }
    local_30 = MBEDTLS_CIPHER_ID_CAMELLIA;
  }
  if (cipher_id != (mbedtls_cipher_id_t *)0x0) {
    *cipher_id = local_30;
  }
  pmVar1 = mbedtls_cipher_info_from_values(local_30,(int)cipher_id_local,local_2c);
  return pmVar1;
}

Assistant:

static const mbedtls_cipher_info_t *mbedtls_cipher_info_from_psa(
    psa_algorithm_t alg,
    psa_key_type_t key_type,
    size_t key_bits,
    mbedtls_cipher_id_t* cipher_id )
{
    mbedtls_cipher_mode_t mode;
    mbedtls_cipher_id_t cipher_id_tmp;

    if( PSA_ALG_IS_AEAD( alg ) )
        alg = PSA_ALG_AEAD_WITH_TAG_LENGTH( alg, 0 );

    if( PSA_ALG_IS_CIPHER( alg ) || PSA_ALG_IS_AEAD( alg ) )
    {
        switch( alg )
        {
            case PSA_ALG_ARC4:
            case PSA_ALG_CHACHA20:
                mode = MBEDTLS_MODE_STREAM;
                break;
            case PSA_ALG_CTR:
                mode = MBEDTLS_MODE_CTR;
                break;
            case PSA_ALG_CFB:
                mode = MBEDTLS_MODE_CFB;
                break;
            case PSA_ALG_OFB:
                mode = MBEDTLS_MODE_OFB;
                break;
            case PSA_ALG_CBC_NO_PADDING:
                mode = MBEDTLS_MODE_CBC;
                break;
            case PSA_ALG_CBC_PKCS7:
                mode = MBEDTLS_MODE_CBC;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CCM, 0 ):
                mode = MBEDTLS_MODE_CCM;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_GCM, 0 ):
                mode = MBEDTLS_MODE_GCM;
                break;
            case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CHACHA20_POLY1305, 0 ):
                mode = MBEDTLS_MODE_CHACHAPOLY;
                break;
            default:
                return( NULL );
        }
    }
    else if( alg == PSA_ALG_CMAC )
        mode = MBEDTLS_MODE_ECB;
    else
        return( NULL );

    switch( key_type )
    {
        case PSA_KEY_TYPE_AES:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_AES;
            break;
        case PSA_KEY_TYPE_DES:
            /* key_bits is 64 for Single-DES, 128 for two-key Triple-DES,
             * and 192 for three-key Triple-DES. */
            if( key_bits == 64 )
                cipher_id_tmp = MBEDTLS_CIPHER_ID_DES;
            else
                cipher_id_tmp = MBEDTLS_CIPHER_ID_3DES;
            /* mbedtls doesn't recognize two-key Triple-DES as an algorithm,
             * but two-key Triple-DES is functionally three-key Triple-DES
             * with K1=K3, so that's how we present it to mbedtls. */
            if( key_bits == 128 )
                key_bits = 192;
            break;
        case PSA_KEY_TYPE_CAMELLIA:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_CAMELLIA;
            break;
        case PSA_KEY_TYPE_ARC4:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_ARC4;
            break;
        case PSA_KEY_TYPE_CHACHA20:
            cipher_id_tmp = MBEDTLS_CIPHER_ID_CHACHA20;
            break;
        default:
            return( NULL );
    }
    if( cipher_id != NULL )
        *cipher_id = cipher_id_tmp;

    return( mbedtls_cipher_info_from_values( cipher_id_tmp,
                                             (int) key_bits, mode ) );
}